

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

void __thiscall ON_SerialNumberMap::EmptyList(ON_SerialNumberMap *this)

{
  ON__UINT64 OVar1;
  uint local_1c;
  ON__UINT64 OStack_18;
  ON__UINT32 i_1;
  ON__UINT64 i;
  ON_SerialNumberMap *this_local;
  
  ON_SerialNumberMapPrivate::SetMaxSn(this->m_private,0);
  this->m_sn_count = 0;
  this->m_sn_purged = 0;
  ON_SN_BLOCK::EmptyBlock(this->m_sn_block0);
  if (this->m_snblk_list != (ON_SN_BLOCK **)0x0) {
    OStack_18 = this->m_snblk_list_capacity;
    while (OVar1 = OStack_18 - 1, OStack_18 != 0) {
      OStack_18 = OVar1;
      if (this->m_snblk_list[OVar1] != (ON_SN_BLOCK *)0x0) {
        onfree(this->m_snblk_list[OVar1]);
      }
    }
    onfree(this->m_snblk_list);
    this->m_snblk_list = (ON_SN_BLOCK **)0x0;
    this->m_snblk_list_capacity = 0;
    this->m_snblk_list_count = 0;
  }
  this->m_bHashTableIsValid = '\0';
  if (this->m_hash_table_blocks != (SN_ELEMENT ***)0x0) {
    for (local_1c = 1; local_1c < this->m_hash_block_count; local_1c = local_1c + 1) {
      onfree(this->m_hash_table_blocks[local_1c]);
    }
    onfree(this->m_hash_table_blocks);
    this->m_hash_table_blocks = (SN_ELEMENT ***)0x0;
  }
  this->m_active_id_count = 0;
  return;
}

Assistant:

void ON_SerialNumberMap::EmptyList()
{
  m_private->SetMaxSn(0);
  m_sn_count = 0;
  m_sn_purged = 0;
  m_sn_block0.EmptyBlock();
  if (m_snblk_list)
  {
    ON__UINT64 i = m_snblk_list_capacity;
    while(i--)
    {
      if ( 0 != m_snblk_list[i] )
        onfree(m_snblk_list[i]);
    }
    onfree(m_snblk_list);
    m_snblk_list = 0;
    m_snblk_list_capacity = 0;
    m_snblk_list_count = 0;
  }
  m_bHashTableIsValid = false;
  if (nullptr != m_hash_table_blocks)
  {
    // Starts at i = 1 because m_hash_table_blocks[] and m_hash_table_blocks[0] 
    // are a single allocation.
    for (ON__UINT32 i = 1; i < m_hash_block_count; i++)
      onfree(m_hash_table_blocks[i]);
    onfree(m_hash_table_blocks); // includes m_hash_table_blocks[0].
    m_hash_table_blocks = nullptr;
  }
  m_active_id_count = 0;
}